

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O1

void __thiscall
pbrt::DisplayItem::ImageChannelBuffer::ImageChannelBuffer
          (ImageChannelBuffer *this,string *channelName,int nTiles,string *title)

{
  pointer puVar1;
  int iVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint64_t zeroHash;
  ulong local_30;
  
  this->tileBoundsOffset = 0;
  this->channelValuesOffset = 0;
  (this->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->tileBoundsOffset = 0;
  this->channelValuesOffset = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->buffer,(long)((int)title->_M_string_length + 0x10020));
  puVar3 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3[0] = '\0';
  puVar3[1] = '\0';
  puVar3[2] = '\0';
  puVar3[3] = '\0';
  puVar3[4] = '\x03';
  puVar3[5] = '\0';
  puVar3 = puVar3 + 6;
  if (title->_M_string_length != 0) {
    uVar4 = 0;
    do {
      puVar3[uVar4] = (title->_M_dataplus)._M_p[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 < title->_M_string_length);
    puVar3 = puVar3 + uVar4;
  }
  *puVar3 = '\0';
  puVar3 = puVar3 + 1;
  if (channelName->_M_string_length != 0) {
    uVar4 = 0;
    do {
      puVar3[uVar4] = (channelName->_M_dataplus)._M_p[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 < channelName->_M_string_length);
    puVar3 = puVar3 + uVar4;
  }
  *puVar3 = '\0';
  puVar1 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = (int)puVar3 - (int)puVar1;
  this->tileBoundsOffset = iVar2 + 1;
  iVar2 = iVar2 + 0x11;
  this->channelValuesOffset = iVar2;
  lVar6 = 0;
  memset(puVar1 + iVar2,0,0x10000);
  uVar4 = 0xa7935bd1e9950000;
  do {
    uVar5 = *(long *)((this->buffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar6 + this->channelValuesOffset) *
            -0x395b586ca42e166b;
    lVar6 = lVar6 + 8;
    uVar4 = (uVar4 ^ (uVar5 >> 0x2f ^ uVar5) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
  } while (lVar6 != 0x10000);
  local_30 = (uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b;
  local_30 = local_30 >> 0x2f ^ local_30;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_fill_assign
            (&this->tileHashes,(long)nTiles,&local_30);
  return;
}

Assistant:

DisplayItem::ImageChannelBuffer::ImageChannelBuffer(const std::string &channelName,
                                                    int nTiles,
                                                    const std::string &title) {
    int bufferAlloc = tileSize * tileSize * sizeof(float) + title.size() + 32;

    buffer.resize(bufferAlloc);

    uint8_t *ptr = buffer.data();
    Serialize(&ptr, int(0));  // reserve space for message length
    Serialize(&ptr, DisplayDirective::UpdateImage);
    uint8_t grabFocus = 0;
    Serialize(&ptr, grabFocus);
    Serialize(&ptr, title);
    Serialize(&ptr, channelName);

    tileBoundsOffset = ptr - buffer.data();
    // Note: may not be float-aligned, but that's not a problem on x86...
    // TODO: fix this. The problem is that it breaks the whole idea of
    // passing a span<Float> to the callback function...
    channelValuesOffset = tileBoundsOffset + 4 * sizeof(int);

    // Zero-initialize the buffer color contents before computing the hash
    // for a fully-zero tile (which corresponds to the initial state on the
    // viewer side.)
    memset(buffer.data() + channelValuesOffset, 0, tileSize * tileSize * sizeof(float));
    uint64_t zeroHash = HashBuffer(buffer.data() + channelValuesOffset,
                                   tileSize * tileSize * sizeof(float));
    tileHashes.assign(nTiles, zeroHash);
}